

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_acc47::PercentTotalKernel::aggregate
          (PercentTotalKernel *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  pointer pEVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  cali_id_t cVar5;
  Config *pCVar6;
  cali_id_t cVar7;
  pointer pEVar8;
  Attribute sum_attr;
  cali_id_t local_58;
  Attribute local_50;
  double local_48;
  Attribute local_38;
  Node *pNVar4;
  
  pCVar6 = this->m_config;
  pNVar4 = (pCVar6->m_target_attr).m_node;
  if (pNVar4 == (Node *)0x0) {
    iVar3 = (*db->_vptr_CaliperMetadataAccessInterface[2])(db,&pCVar6->m_target_attr_name);
    pNVar4 = (Node *)CONCAT44(extraout_var,iVar3);
    (pCVar6->m_target_attr).m_node = pNVar4;
    pCVar6 = this->m_config;
  }
  local_50.m_node = (Node *)0x0;
  bVar2 = Config::get_percentage_attribute(pCVar6,db,&local_38,&local_50);
  if (bVar2) {
    local_58 = 0xffffffffffffffff;
    cVar7 = 0xffffffffffffffff;
    if (pNVar4 != (Node *)0x0) {
      cVar7 = pNVar4->m_id;
    }
    if (local_50.m_node != (Node *)0x0) {
      local_58 = (local_50.m_node)->m_id;
    }
    pEVar1 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pEVar8 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
                  super__Vector_impl_data._M_start; pEVar8 != pEVar1; pEVar8 = pEVar8 + 1) {
      pNVar4 = pEVar8->m_node;
      if (pNVar4 == (Node *)0x0) {
        cVar5 = 0xffffffffffffffff;
      }
      else {
        cVar5 = pNVar4->m_attribute;
        if (cVar5 == 8) {
          cVar5 = pNVar4->m_id;
        }
      }
      if ((cVar5 == cVar7) || (cVar5 == local_58)) {
        local_48 = cali_variant_to_double((pEVar8->m_value).m_v,(_Bool *)0x0);
        this->m_sum = local_48 + this->m_sum;
        this->m_isum = local_48 + this->m_isum;
        pCVar6 = this->m_config;
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)&pCVar6->m_total_lock);
        if (iVar3 != 0) {
          std::__throw_system_error(iVar3);
        }
        pCVar6->m_total = local_48 + pCVar6->m_total;
        pthread_mutex_unlock((pthread_mutex_t *)&pCVar6->m_total_lock);
      }
    }
  }
  return;
}

Assistant:

void aggregate(CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        Attribute target_attr = m_config->get_target_attr(db);
        Attribute percentage_attr, sum_attr;

        if (!m_config->get_percentage_attribute(db, percentage_attr, sum_attr))
            return;

        cali_id_t target_id = target_attr.id();
        cali_id_t sum_id    = sum_attr.id();

        for (const Entry& e : list) {
            cali_id_t id = e.attribute();

            if (id == target_id || id == sum_id) {
                double val = e.value().to_double();
                m_sum += val;
                m_isum += val;
                m_config->add(val);
            }
        }
    }